

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O3

void __thiscall HashTable<int>::~HashTable(HashTable<int> *this)

{
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  do {
    pnVar3 = this->HashArray[lVar4].next;
    if (pnVar3 != (node *)0x0) {
      pnVar1 = pnVar3->next;
      while (pnVar2 = pnVar1, pnVar2 != (node *)0x0) {
        operator_delete(pnVar3);
        pnVar3 = pnVar2;
        pnVar1 = pnVar2->next;
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  return;
}

Assistant:

~HashTable() {
		Node *p, *pp;
		for (int i = 0; i < 20; i++) {
			if (HashArray[i].next != NULL) {
				p = pp = HashArray[i].next;
				while (p->next != NULL) {
					pp = p;
					p = p->next;
					delete pp;
				}
			}
		}
	}